

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
MDIOSimulationDataGenerator::CreateMdioC45Transaction
          (MDIOSimulationDataGenerator *this,MdioOpCode opCode,U8 phyAddress,MdioDevType devType,
          U16 regAddress,U16 data)

{
  bool bVar1;
  U16 data_local;
  U16 regAddress_local;
  MdioDevType devType_local;
  U8 phyAddress_local;
  MdioOpCode opCode_local;
  MDIOSimulationDataGenerator *this_local;
  
  CreateStart(this,C45_START);
  CreateOpCode(this,C45_ADDRESS);
  CreatePhyAddress(this,phyAddress);
  CreateDevType(this,devType);
  bVar1 = IsReadOperation(this,opCode);
  CreateTurnAround(this,bVar1);
  CreateAddressOrData(this,regAddress);
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  CreateStart(this,C45_START);
  CreateOpCode(this,opCode);
  CreatePhyAddress(this,phyAddress);
  CreateDevType(this,devType);
  bVar1 = IsReadOperation(this,opCode);
  CreateTurnAround(this,bVar1);
  CreateAddressOrData(this,data);
  return;
}

Assistant:

void MDIOSimulationDataGenerator::CreateMdioC45Transaction( MdioOpCode opCode, U8 phyAddress, MdioDevType devType, U16 regAddress,
                                                            U16 data )
{
    // A Clause 45 transaction consists of TWO packets.
    // The first frame contains a 16 bit register address, the second has the 16 bit data

    // First packet
    CreateStart( C45_START );
    CreateOpCode( C45_ADDRESS );
    CreatePhyAddress( phyAddress );
    CreateDevType( devType );
    CreateTurnAround( IsReadOperation( opCode ) );
    CreateAddressOrData( regAddress );

    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) ); // insert 1 periods of idle

    // Second packet
    CreateStart( C45_START );
    CreateOpCode( opCode );
    CreatePhyAddress( phyAddress );
    CreateDevType( devType );
    CreateTurnAround( IsReadOperation( opCode ) );
    CreateAddressOrData( data );
}